

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zlib_bench.cc
# Opt level: O3

void zlib_file(char *name,zlib_wrapper type,int width,int check,bool output_csv_format)

{
  pointer pbVar1;
  char cVar2;
  char *pcVar3;
  long lVar4;
  size_type *psVar5;
  long lVar6;
  uint uVar7;
  int iVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  ulong uVar12;
  char *pcVar13;
  int iVar14;
  size_type __n;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  double dVar18;
  undefined1 auVar19 [16];
  double dVar20;
  vector<unsigned_long,_std::allocator<unsigned_long>_> input_length;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  compressed;
  vector<const_char_*,_std::allocator<const_char_*>_> input;
  double ctime [5];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  output;
  double utime [5];
  long local_160;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_130;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_118;
  vector<const_char_*,_std::allocator<const_char_*>_> local_100;
  double *local_e8 [2];
  double local_d8 [3];
  undefined1 local_c0 [8];
  char *local_b8;
  double dStack_b0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  undefined1 local_88 [16];
  _Alloc_hider local_78;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_68;
  double local_58 [5];
  
  read_file_data_or_exit((Data *)local_88,name);
  pcVar13 = (char *)local_88._0_8_;
  if (check == 0) {
    pcVar3 = zlib_level_strategy_name(zlib_compression_level);
    if (!output_csv_format) {
      printf("%s%-40s :\n",pcVar3,name);
    }
    iVar14 = local_88._8_4_ + 0x1ffffe;
    if (-1 < (int)(local_88._8_4_ + 0xfffff)) {
      iVar14 = local_88._8_4_ + 0xfffff;
    }
    uVar7 = iVar14 >> 0x14;
    __n = (size_type)(int)uVar7;
    local_b8 = name;
    std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
              (&local_100,__n,(allocator_type *)local_e8);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              (&local_130,__n,(allocator_type *)local_e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_118,__n,(allocator_type *)local_e8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_a0,__n,(allocator_type *)local_e8);
    uVar15 = 1;
    if (1 < (int)uVar7) {
      uVar15 = uVar7;
    }
    uVar12 = (ulong)uVar15;
    if (0 < (int)local_88._8_4_) {
      lVar6 = 0;
      lVar10 = 0x100000;
      uVar11 = 0;
      do {
        lVar4 = (long)(int)local_88._8_4_;
        if (lVar10 < (int)local_88._8_4_) {
          lVar4 = lVar10;
        }
        local_100.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start[uVar11] = pcVar13;
        local_130.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start[uVar11] = lVar4 + lVar6;
        uVar11 = uVar11 + 1;
        pcVar13 = pcVar13 + 0x100000;
        lVar10 = lVar10 + 0x100000;
        lVar6 = lVar6 + -0x100000;
      } while (uVar12 != uVar11);
    }
    uVar11 = (long)(int)(local_88._8_4_ + 0xa00000) / (long)(int)(local_88._8_4_ + 1);
    lVar6 = uVar12 << 5;
    local_160 = 0;
    do {
      iVar14 = (int)uVar11;
      if ((int)local_88._8_4_ < 1) {
        lVar10 = std::chrono::_V2::steady_clock::now();
LAB_00102f1d:
        lVar4 = std::chrono::_V2::steady_clock::now();
        local_e8[local_160] = (double *)((double)(lVar4 - lVar10) / 1000000000.0);
        if (0 < (int)local_88._8_4_) {
          lVar10 = 0;
          lVar4 = 0;
          do {
            zlib_compress(type,*(char **)((long)local_100.
                                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                                ._M_impl.super__Vector_impl_data._M_start +
                                         lVar4 * 4),
                          *(size_t *)
                           ((long)local_130.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start + lVar4 * 4),
                          (string *)
                          ((long)&((local_118.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                          lVar10),true);
            lVar4 = lVar4 + 2;
            lVar10 = lVar10 + 0x20;
          } while (lVar6 != lVar10);
          if (0 < (int)local_88._8_4_) {
            lVar10 = 0;
            lVar4 = 0;
            do {
              std::__cxx11::string::resize
                        ((long)&((local_a0.
                                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                         lVar4,(char)*(undefined8 *)
                                      ((long)local_130.
                                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar10 * 4)
                        );
              lVar4 = lVar4 + 0x20;
              lVar10 = lVar10 + 2;
            } while (lVar6 != lVar4);
          }
        }
      }
      else {
        lVar10 = 0;
        do {
          pbVar1 = local_118.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          cVar2 = compressBound(0x100000);
          std::__cxx11::string::resize((long)&(pbVar1->_M_dataplus)._M_p + lVar10,cVar2);
          lVar10 = lVar10 + 0x20;
        } while (lVar6 != lVar10);
        lVar10 = std::chrono::_V2::steady_clock::now();
        if (0 < (int)local_88._8_4_) {
          uVar9 = 0;
          do {
            uVar16 = uVar11 & 0xffffffff;
            if (0 < iVar14) {
              do {
                zlib_compress(type,local_100.
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start[uVar9],
                              local_130.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start[uVar9],
                              local_118.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start + uVar9,false);
                uVar15 = (int)uVar16 - 1;
                uVar16 = (ulong)uVar15;
              } while (uVar15 != 0);
            }
            uVar9 = uVar9 + 1;
          } while (uVar9 != uVar12);
          goto LAB_00102f1d;
        }
        lVar4 = std::chrono::_V2::steady_clock::now();
        local_e8[local_160] = (double *)((double)(lVar4 - lVar10) / 1000000000.0);
      }
      lVar10 = std::chrono::_V2::steady_clock::now();
      if (0 < iVar14) {
        iVar8 = 0;
        do {
          if (0 < (int)local_88._8_4_) {
            lVar4 = 0;
            lVar17 = 0;
            do {
              zlib_uncompress(type,(string *)
                                   ((long)&((local_118.
                                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus
                                           )._M_p + lVar17),
                              *(size_t *)
                               ((long)local_130.
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start + lVar4 * 4),
                              (string *)
                              ((long)&((local_a0.
                                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                      _M_p + lVar17));
              lVar17 = lVar17 + 0x20;
              lVar4 = lVar4 + 2;
            } while (lVar6 != lVar17);
          }
          iVar8 = iVar8 + 1;
        } while (iVar8 != iVar14);
      }
      lVar4 = std::chrono::_V2::steady_clock::now();
      local_58[local_160] = (double)(lVar4 - lVar10) / 1000000000.0;
      if (0 < (int)local_88._8_4_) {
        lVar10 = 0;
        lVar4 = 0;
        do {
          verify_equal(*(char **)((long)local_100.
                                        super__Vector_base<const_char_*,_std::allocator<const_char_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar4 * 4),
                       *(size_t *)
                        ((long)local_130.
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_start + lVar4 * 4),
                       (string *)
                       ((long)&((local_a0.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                       lVar10));
          lVar4 = lVar4 + 2;
          lVar10 = lVar10 + 0x20;
        } while (lVar6 != lVar10);
      }
      local_160 = local_160 + 1;
    } while (local_160 != 5);
    if ((long)local_118.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_118.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start == 0) {
      lVar6 = 0;
    }
    else {
      lVar10 = (long)local_118.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_118.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 5;
      lVar10 = lVar10 + (ulong)(lVar10 == 0);
      psVar5 = &(local_118.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
      lVar6 = 0;
      do {
        lVar6 = lVar6 + *psVar5;
        psVar5 = psVar5 + 4;
        lVar10 = lVar10 + -1;
      } while (lVar10 != 0);
    }
    std::__insertion_sort<double*,__gnu_cxx::__ops::_Iter_less_iter>(local_e8,local_c0);
    std::__insertion_sort<double*,__gnu_cxx::__ops::_Iter_less_iter>
              (local_58,&stack0xffffffffffffffd0);
    iVar14 = iVar14 * local_88._8_4_;
    iVar8 = iVar14 + 0xfffff;
    if (-1 < iVar14) {
      iVar8 = iVar14;
    }
    dVar18 = (double)(iVar8 >> 0x14);
    auVar19._8_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar19._0_8_ = lVar6;
    auVar19._12_4_ = 0x45300000;
    dVar20 = auVar19._8_8_ - 1.9342813113834067e+25;
    if (output_csv_format) {
      printf("%s\t%.5lf\t%.5lf\t%.5lf\t%.5lf\t%.5lf\n",local_b8);
    }
    else {
      local_b8 = (char *)(((dVar20 + ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0))
                          * 100.0) / (double)(int)local_88._8_4_);
      dStack_b0 = dVar20;
      pcVar13 = zlib_wrapper_name(type);
      printf("%s: [b %dM] bytes %*d -> %*u %4.2f%%",local_b8,pcVar13,1,(ulong)(uint)width,
             (ulong)(uint)local_88._8_4_,(ulong)(uint)width,(int)lVar6);
      printf(" comp %5.1f (%5.1f) MB/s uncomp %5.1f (%5.1f) MB/s\n",dVar18 / local_d8[0],
             dVar18 / (double)local_e8[0],dVar18 / local_58[2],dVar18 / local_58[0]);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_118);
    if (local_130.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_130.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_130.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_130.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_100.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_100.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_100.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_100.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  else {
    std::__cxx11::string::find_last_of((char *)&local_78,0x1041b7,0xffffffffffffffff);
    std::__cxx11::string::substr((ulong)local_e8,(ulong)&local_78);
    std::__cxx11::string::operator=((string *)&local_78,(string *)local_e8);
    if (local_e8[0] != local_d8) {
      operator_delete(local_e8[0],(long)local_d8[0] + 1);
    }
    check_file((Data *)local_88,type,check);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_p != &local_68) {
    operator_delete(local_78._M_p,local_68._M_allocated_capacity + 1);
  }
  if ((char *)local_88._0_8_ != (char *)0x0) {
    operator_delete__((void *)local_88._0_8_);
  }
  return;
}

Assistant:

void zlib_file(const char* name,
               zlib_wrapper type,
               int width,
               int check,
               bool output_csv_format) {
  /*
   * Read the file data.
   */
  struct Data file = read_file_data_or_exit(name);
  const int length = static_cast<int>(file.size);
  const char* data = file.data.get();

  /*
   * Compress file: report output data checks and return.
   */
  if (check) {
    file.name = file.name.substr(file.name.find_last_of("/\\") + 1);
    check_file(file, type, check);
    return;
  }

  /*
   * Report compression strategy and file name.
   */
  const char* strategy = zlib_level_strategy_name(zlib_compression_level);
  if (!output_csv_format) {
    printf("%s%-40s :\n", strategy, name);
  }

  /*
   * Chop the data into blocks.
   */
  const int block_size = 1 << 20;
  const int blocks = (length + block_size - 1) / block_size;

  std::vector<const char*> input(blocks);
  std::vector<size_t> input_length(blocks);
  std::vector<std::string> compressed(blocks);
  std::vector<std::string> output(blocks);

  for (int b = 0; b < blocks; ++b) {
    int input_start = b * block_size;
    int input_limit = std::min<int>((b + 1) * block_size, length);
    input[b] = data + input_start;
    input_length[b] = input_limit - input_start;
  }

  /*
   * Run the zlib compress/uncompress loop a few times with |repeats| to
   * process about 10MB of data if the length is small relative to 10MB.
   * If length is large relative to 10MB, process the data once.
   */
  const int mega_byte = 1024 * 1024;
  const int repeats = (10 * mega_byte + length) / (length + 1);
  const int runs = 5;
  double ctime[runs];
  double utime[runs];

  for (int run = 0; run < runs; ++run) {
    const auto now = [] { return std::chrono::steady_clock::now(); };

    // Pre-grow the output buffer so we don't measure string resize time.
    for (int b = 0; b < blocks; ++b)
      compressed[b].resize(zlib_estimate_compressed_size(block_size));

    auto start = now();
    for (int b = 0; b < blocks; ++b)
      for (int r = 0; r < repeats; ++r)
        zlib_compress(type, input[b], input_length[b], &compressed[b]);
    ctime[run] = std::chrono::duration<double>(now() - start).count();

    // Compress again, resizing compressed, so we don't leave junk at the
    // end of the compressed string that could confuse zlib_uncompress().
    for (int b = 0; b < blocks; ++b)
      zlib_compress(type, input[b], input_length[b], &compressed[b], true);

    for (int b = 0; b < blocks; ++b)
      output[b].resize(input_length[b]);

    start = now();
    for (int r = 0; r < repeats; ++r)
      for (int b = 0; b < blocks; ++b)
        zlib_uncompress(type, compressed[b], input_length[b], &output[b]);
    utime[run] = std::chrono::duration<double>(now() - start).count();

    for (int b = 0; b < blocks; ++b)
      verify_equal(input[b], input_length[b], &output[b]);
  }

  /*
   * Output the median/maximum compress/uncompress rates in MB/s.
   */
  size_t output_length = 0;
  for (size_t i = 0; i < compressed.size(); ++i)
    output_length += compressed[i].size();

  std::sort(ctime, ctime + runs);
  std::sort(utime, utime + runs);

  double deflate_rate_med, inflate_rate_med, deflate_rate_max, inflate_rate_max;
  deflate_rate_med = length * repeats / mega_byte / ctime[runs / 2];
  inflate_rate_med = length * repeats / mega_byte / utime[runs / 2];
  deflate_rate_max = length * repeats / mega_byte / ctime[0];
  inflate_rate_max = length * repeats / mega_byte / utime[0];
  double compress_ratio = output_length * 100.0 / length;

  if (!output_csv_format) {
    // type, block size, compression ratio, etc
    printf("%s: [b %dM] bytes %*d -> %*u %4.2f%%", zlib_wrapper_name(type),
           block_size / (1 << 20), width, length, width,
           unsigned(output_length), compress_ratio);

    // compress / uncompress median (max) rates
    printf(" comp %5.1f (%5.1f) MB/s uncomp %5.1f (%5.1f) MB/s\n",
           deflate_rate_med, deflate_rate_max, inflate_rate_med,
           inflate_rate_max);
  } else {
    printf("%s\t%.5lf\t%.5lf\t%.5lf\t%.5lf\t%.5lf\n", name, deflate_rate_med,
           inflate_rate_med, deflate_rate_max, inflate_rate_max,
           compress_ratio);
  }
}